

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
logonAtLogonStartTimeFixture::~logonAtLogonStartTimeFixture(logonAtLogonStartTimeFixture *this)

{
  anon_unknown.dwarf_52c65e::sessionFixture::~sessionFixture((sessionFixture *)this);
  operator_delete(this,0x640);
  return;
}

Assistant:

logonAtLogonStartTimeFixture() {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);

    endTime = now;
    endTime.setMillisecond(0);

    startTime += -10;
    endTime += 10;

    UtcTimeOnly logonStartTime(now);
    UtcTimeOnly logonEndTime(now);
    logonStartTime += 1;
    logonEndTime += 2;
    TimeRange logonTime(logonStartTime, logonEndTime);

    object->setLogonTime(logonTime);
  }